

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

int __thiscall Clasp::Cli::ClaspCliConfig::getValue(ClaspCliConfig *this,KeyType key,string *out)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UserConfig *pUVar5;
  unsigned_long uVar6;
  string *in_RDX;
  uint32 in_ESI;
  ClaspConfig *in_RDI;
  StringRef str_6;
  StringRef str_5;
  StringRef str_4;
  StringRef str_3;
  StringRef str_2;
  Set<Clasp::HeuParams::DomPref> pick;
  Set<Clasp::HeuParams::DomMod> mod;
  StringRef str_1;
  StringRef str;
  SolveParams *search;
  SolverParams *solver;
  uint32 sId;
  int r;
  int16 o;
  UserConfig *base;
  undefined4 in_stack_fffffffffffff428;
  undefined4 in_stack_fffffffffffff42c;
  ClaspConfig *in_stack_fffffffffffff430;
  undefined8 in_stack_fffffffffffff438;
  ConfigKey x;
  string *in_stack_fffffffffffff440;
  undefined7 in_stack_fffffffffffff480;
  undefined1 in_stack_fffffffffffff487;
  char **in_stack_fffffffffffff488;
  CCMinAntes *in_stack_fffffffffffff490;
  double *in_stack_fffffffffffff498;
  StringRef local_ae0;
  StringRef local_ad8;
  string local_ad0 [36];
  uint local_aac;
  string local_aa8 [32];
  string local_a88 [36];
  uint local_a64;
  uint local_a60;
  uint local_a5c;
  string local_a58 [32];
  uint local_a38;
  uint local_a34;
  uint32 local_a30;
  uint local_a2c;
  StringRef local_a28;
  string local_a20 [36];
  SearchMode local_9fc;
  string local_9f8 [32];
  Range<unsigned_long> local_9d8;
  undefined4 local_9c4;
  Range<unsigned_long> local_9c0;
  undefined4 local_9ac;
  string local_9a8 [36];
  uint local_984;
  string local_980 [36];
  uint local_95c;
  string local_958 [36];
  uint local_934;
  string local_930 [36];
  uint local_90c;
  string local_908 [36];
  uint local_8e4;
  string local_8e0 [36];
  uint local_8bc;
  string local_8b8 [36];
  uint local_894;
  string local_890 [36];
  TrMode local_86c;
  string local_868 [36];
  uint local_844;
  string local_840 [32];
  uint local_820;
  uint local_81c;
  string local_818 [32];
  string local_7f8 [36];
  uint local_7d4;
  string local_7d0 [36];
  int local_7ac;
  double local_7a8;
  string local_7a0 [32];
  string local_780 [32];
  StringRef local_760;
  uint local_754;
  uint local_750;
  uint local_74c;
  string local_748 [32];
  uint local_728;
  uint local_724;
  string local_720 [32];
  uint local_700;
  uint local_6fc;
  float local_6f8;
  uint local_6f4;
  StringRef local_6f0;
  uint local_6e8;
  uint local_6e4;
  string local_6e0 [36];
  uint local_6bc;
  string local_6b8 [36];
  uint local_694;
  string local_690 [32];
  string local_670 [32];
  uint local_650;
  uint local_64c;
  string local_648 [24];
  string local_600 [32];
  uint local_5e0;
  uint local_5dc;
  string local_5d8 [36];
  uint local_5b4;
  string local_5b0 [32];
  uint local_590;
  uint local_58c;
  string local_588 [36];
  uint local_564;
  string local_560 [36];
  uint local_53c;
  string local_538 [32];
  uint local_518;
  uint local_514;
  string local_510 [36];
  uint local_4ec;
  string local_4e8 [32];
  char *local_4c8;
  uint local_4c0;
  uint local_4bc;
  string local_4b8 [36];
  Set<Clasp::SolverParams::Forget> local_494;
  string local_490 [39];
  byte local_469;
  string local_468 [32];
  string local_448 [36];
  uint local_424;
  string local_420 [36];
  uint local_3fc;
  string local_3f8 [36];
  uint local_3d4;
  string local_3d0 [36];
  uint local_3ac;
  string local_3a8 [32];
  Set<Clasp::HeuParams::DomPref> local_388;
  Set<Clasp::HeuParams::DomMod> local_384;
  StringRef local_380;
  uint local_374;
  string local_370 [36];
  uint local_34c;
  uint local_348;
  uint local_344;
  string local_340 [36];
  uint local_31c;
  string local_318 [36];
  uint local_2f4;
  string local_2f0 [36];
  uint local_2cc;
  string local_2c8 [36];
  uint local_2a4;
  string local_2a0 [36];
  uint local_27c;
  string local_278 [36];
  uint local_254;
  string local_250 [36];
  uint local_22c;
  string local_228 [32];
  uint local_208;
  uint local_204;
  string local_200 [32];
  uint local_1e0;
  uint local_1dc;
  string local_1d8 [36];
  uint local_1b4;
  string local_1b0 [36];
  Set<Clasp::OptParams::Heuristic> local_18c;
  string local_188 [32];
  uint local_168;
  uint local_164;
  string local_160 [32];
  string local_140 [39];
  undefined1 local_119;
  string local_118 [39];
  undefined1 local_f1;
  string local_f0 [37];
  byte local_cb;
  byte local_ca;
  byte local_c9;
  StringRef local_c8;
  string local_c0 [39];
  byte local_99;
  string local_98 [36];
  uint local_74;
  string local_70 [32];
  long local_50;
  ulong *local_48;
  uint local_40;
  int local_3c;
  short local_36;
  ClaspConfig *local_28;
  string *local_20;
  uint32 local_14;
  
  x = (ConfigKey)((ulong)in_stack_fffffffffffff438 >> 0x20);
  local_20 = in_RDX;
  local_14 = in_ESI;
  decodeMode(in_ESI);
  local_28 = (ClaspConfig *)
             active(in_stack_fffffffffffff430,(uint8)((uint)in_stack_fffffffffffff42c >> 0x18));
  local_36 = decodeKey(local_14);
  bVar1 = isLeafId(local_36);
  local_3c = -1;
  if (bVar1 && local_28 != (ClaspConfig *)0x0) {
    local_3c = 1;
  }
  if ((local_3c < 1) || (bVar1 = isOption((int)local_36), !bVar1)) {
    if ((0 < local_3c) && (local_36 == 0)) {
      if ((local_28->super_BasicSatConfig).super_ContextParams.cliConfig < 0x14) {
        Cli::xconvert(in_stack_fffffffffffff440,x);
      }
      else {
        ClaspConfig::testerConfig(in_RDI);
        std::__cxx11::string::append((string *)local_20);
      }
    }
  }
  else {
    if ((local_28 != in_RDI) && (bVar1 = isTesterOption(0), !bVar1)) {
      Potassco::fail(-1,"int Clasp::Cli::ClaspCliConfig::getValue(KeyType, std::string &) const",
                     0x3a8,"base == this || isTesterOption(o)",(char *)0x0);
    }
    bVar2 = decodeSolver(local_14);
    local_40 = (uint)bVar2;
    iVar3 = (*(local_28->super_BasicSatConfig).super_UserConfiguration.super_Configuration.
              _vptr_Configuration[6])(local_28,(ulong)local_40);
    local_48 = (ulong *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*(local_28->super_BasicSatConfig).super_UserConfiguration.super_Configuration.
              _vptr_Configuration[7])(local_28,(ulong)local_40);
    local_50 = CONCAT44(extraout_var_00,iVar3);
    switch(local_36) {
    case 1:
      local_74 = (byte)(local_28->super_BasicSatConfig).super_ContextParams.field_0x8 & 7;
      Potassco::toString<Clasp::ContextParams::ShareMode>
                ((ShareMode *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_70);
      std::__cxx11::string::~string(local_70);
      break;
    case 2:
      local_99 = (byte)(local_28->super_BasicSatConfig).super_ContextParams.field_0x8 >> 5 & 1;
      Potassco::toString<unsigned_char>
                ((uchar *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_98);
      std::__cxx11::string::~string(local_98);
      break;
    case 3:
      Potassco::toString<Clasp::SatPreParams>
                ((SatPreParams *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_c0);
      std::__cxx11::string::~string(local_c0);
      break;
    case 4:
      Potassco::StringRef::StringRef(&local_c8,local_20);
      if (local_c8.out != (string *)0x0) {
        pUVar5 = ClaspConfig::testerConfig(in_RDI);
        if ((pUVar5 == (UserConfig *)0x0) ||
           (pUVar5 = ClaspConfig::testerConfig(in_RDI),
           ((byte)(pUVar5->super_ContextParams).field_0x8 >> 3 & 3) == 0)) {
          local_c9 = (byte)(in_RDI->super_BasicSatConfig).super_ContextParams.field_0x8 >> 3 & 3;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (uchar *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
        else {
          local_ca = (byte)(in_RDI->super_BasicSatConfig).super_ContextParams.field_0x8 >> 3 & 3;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (uchar *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          pUVar5 = ClaspConfig::testerConfig(in_RDI);
          local_cb = (byte)(pUVar5->super_ContextParams).field_0x8 >> 3 & 3;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (uchar *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
      }
      break;
    case 5:
      local_f1 = ParserOptions::anyOf(&in_RDI->parse,'?');
      Potassco::toString<bool>
                ((bool *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_f0);
      std::__cxx11::string::~string(local_f0);
      break;
    case 6:
      local_119 = ParserOptions::isEnabled(&in_RDI->parse,parse_maxsat);
      Potassco::toString<bool>
                ((bool *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_118);
      std::__cxx11::string::~string(local_118);
      break;
    case 7:
      Potassco::toString<Clasp::OptParams>
                ((OptParams *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_140);
      std::__cxx11::string::~string(local_140);
      break;
    case 8:
      if (((uint)local_48[2] >> 5 & 7) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_164 = (uint)local_48[2] >> 5 & 7;
        local_168 = (uint)local_48[2] >> 0xc & 0x1f;
        Potassco::toString<Clasp::OptParams::UscTrim,unsigned_int>
                  ((UscTrim *)in_stack_fffffffffffff488,
                   (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_160);
      std::__cxx11::string::~string(local_160);
      break;
    case 9:
      Potassco::Set<Clasp::OptParams::Heuristic>::Set(&local_18c,(uint)local_48[2] >> 1 & 3);
      Potassco::toString<Potassco::Set<Clasp::OptParams::Heuristic>>
                ((Set<Clasp::OptParams::Heuristic> *)
                 CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_188);
      std::__cxx11::string::~string(local_188);
      break;
    case 10:
      local_1b4 = (uint)(*local_48 >> 0x34) & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_1b0);
      std::__cxx11::string::~string(local_1b0);
      break;
    case 0xb:
      if (((uint)local_48[3] >> 0x10 & 3) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_1dc = *(ushort *)((long)local_48 + 0x1a) & 3;
        local_1e0 = (uint)(ushort)local_48[3];
        Potassco::toString<Clasp::Var_t::Type,unsigned_int>
                  ((Type *)in_stack_fffffffffffff488,
                   (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      break;
    case 0xc:
      local_204 = *(uint *)((long)local_48 + 4) & 7;
      local_208 = (uint)(ushort)local_48[1];
      Potassco::toString<Clasp::Heuristic_t::Type,unsigned_int>
                ((Type *)in_stack_fffffffffffff488,
                 (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      std::__cxx11::string::operator=((string *)local_20,local_200);
      std::__cxx11::string::~string(local_200);
      break;
    case 0xd:
      local_22c = (uint)local_48[1] >> 0x14 & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_228);
      std::__cxx11::string::~string(local_228);
      break;
    case 0xe:
      local_254 = *(ushort *)((long)local_48 + 10) & 3;
      Potassco::toString<Clasp::HeuParams::Score>
                ((Score *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_250);
      std::__cxx11::string::~string(local_250);
      break;
    case 0xf:
      local_27c = (uint)local_48[1] >> 0x12 & 3;
      Potassco::toString<Clasp::HeuParams::ScoreOther>
                ((ScoreOther *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_278);
      std::__cxx11::string::~string(local_278);
      break;
    case 0x10:
      local_2a4 = (uint)(*local_48 >> 0x35) & 3;
      Potassco::toString<Clasp::SolverStrategies::SignHeu>
                ((SignHeu *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_2a0);
      std::__cxx11::string::~string(local_2a0);
      break;
    case 0x11:
      local_2cc = (uint)(*local_48 >> 0x37) & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_2c8);
      std::__cxx11::string::~string(local_2c8);
      break;
    case 0x12:
      local_2f4 = (uint)local_48[1] >> 0x16 & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_2f0);
      std::__cxx11::string::~string(local_2f0);
      break;
    case 0x13:
      local_31c = (uint)local_48[1] >> 0x17 & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_318);
      std::__cxx11::string::~string(local_318);
      break;
    case 0x14:
      if ((*(uint *)((long)local_48 + 0xc) & 0x3ff) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_344 = *(uint *)((long)local_48 + 0xc) & 0x3ff;
        local_348 = *(uint *)((long)local_48 + 0xc) >> 10 & 0x7f;
        local_34c = *(uint *)((long)local_48 + 0xc) >> 0x11;
        Potassco::toString<unsigned_int,unsigned_int,unsigned_int>
                  ((uint *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                   (uint *)in_stack_fffffffffffff488);
      }
      std::__cxx11::string::operator=((string *)local_20,local_340);
      std::__cxx11::string::~string(local_340);
      break;
    case 0x15:
      local_374 = (uint)local_48[1] >> 0x15 & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_370);
      std::__cxx11::string::~string(local_370);
      break;
    case 0x16:
      Potassco::StringRef::StringRef(&local_380,local_20);
      if (local_380.out != (string *)0x0) {
        Potassco::Set<Clasp::HeuParams::DomMod>::Set(&local_384,(uint)local_48[1] >> 0x1d);
        Potassco::Set<Clasp::HeuParams::DomPref>::Set
                  (&local_388,*(byte *)((long)local_48 + 0xb) & 0x1f);
        uVar4 = Potassco::Set<Clasp::HeuParams::DomMod>::value(&local_384);
        if ((uVar4 == 0) ||
           (uVar4 = Potassco::Set<Clasp::HeuParams::DomPref>::value(&local_388), uVar4 == 0)) {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (Set<Clasp::HeuParams::DomMod> *)
                     CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
        else {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (Set<Clasp::HeuParams::DomMod> *)
                     CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (Set<Clasp::HeuParams::DomPref> *)
                     CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
      }
      break;
    case 0x17:
      local_3ac = (uint)*(ushort *)((long)local_48 + 2);
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_3a8);
      std::__cxx11::string::~string(local_3a8);
      break;
    case 0x18:
      local_3d4 = (uint)(*local_48 >> 0x2f) & 3;
      Potassco::toString<Clasp::SolverStrategies::WatchInit>
                ((WatchInit *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_3d0);
      std::__cxx11::string::~string(local_3d0);
      break;
    case 0x19:
      local_3fc = (uint)(*local_48 >> 0x31) & 1;
      Potassco::toString<Clasp::SolverStrategies::UpdateMode>
                ((UpdateMode *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_3f8);
      std::__cxx11::string::~string(local_3f8);
      break;
    case 0x1a:
      local_424 = (uint)((local_48[3] & 0x100000) == 0);
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_420);
      std::__cxx11::string::~string(local_420);
      break;
    case 0x1b:
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_448);
      std::__cxx11::string::~string(local_448);
      break;
    case 0x1c:
      local_469 = (byte)(*local_48 >> 0x33) & 1;
      Potassco::toString<bool>
                ((bool *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_468);
      std::__cxx11::string::~string(local_468);
      break;
    case 0x1d:
      Potassco::Set<Clasp::SolverParams::Forget>::Set(&local_494,(uint)local_48[3] >> 0x15 & 0xf);
      Potassco::toString<Potassco::Set<Clasp::SolverParams::Forget>>
                ((Set<Clasp::SolverParams::Forget> *)
                 CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_490);
      std::__cxx11::string::~string(local_490);
      break;
    case 0x1e:
      if (((uint)(*local_48 >> 0x29) & 3) == 3) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_4bc = (uint)(*local_48 >> 0x2d) & 1;
        local_4c0 = (uint)(*local_48 >> 0x29) & 3;
        local_4c8 = "yes";
        if ((*local_48 >> 0x2e & 1) != 0) {
          local_4c8 = "no";
        }
        Potassco::
        toString<Clasp::SolverStrategies::CCMinType,Clasp::SolverStrategies::CCMinAntes,char_const*>
                  ((CCMinType *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                   in_stack_fffffffffffff488);
      }
      std::__cxx11::string::operator=((string *)local_20,local_4b8);
      std::__cxx11::string::~string(local_4b8);
      break;
    case 0x1f:
      local_4ec = (uint)(*local_48 >> 0x25) & 3;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_4e8);
      std::__cxx11::string::~string(local_4e8);
      break;
    case 0x20:
      if ((*local_48 >> 0x27 & 3) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_514 = (uint)(*local_48 >> 0x27) & 3;
        local_518 = *(uint *)(local_50 + 0x40) & 0x7f;
        Potassco::toString<Clasp::SolverStrategies::LbdMode,unsigned_int>
                  ((LbdMode *)in_stack_fffffffffffff488,
                   (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_510);
      std::__cxx11::string::~string(local_510);
      break;
    case 0x21:
      local_53c = (uint)(*local_48 >> 0x32) & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_538);
      std::__cxx11::string::~string(local_538);
      break;
    case 0x22:
      local_564 = (uint)(*local_48 >> 0x23) & 3;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_560);
      std::__cxx11::string::~string(local_560);
      break;
    case 0x23:
      if ((*local_48 & 0xffff) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_58c = (uint)(ushort)*local_48;
        local_590 = (uint)(*local_48 >> 0x2b) & 3;
        Potassco::toString<unsigned_int,Clasp::SolverStrategies::CCRepMode>
                  ((uint *)in_stack_fffffffffffff488,
                   (CCRepMode *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_588);
      std::__cxx11::string::~string(local_588);
      break;
    case 0x24:
      local_5b4 = (uint)local_48[3] >> 0x12 & 3;
      Potassco::toString<Clasp::DefaultUnfoundedCheck::ReasonStrategy>
                ((ReasonStrategy *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_5b0);
      std::__cxx11::string::~string(local_5b0);
      break;
    case 0x25:
      if ((*(uint *)(local_50 + 0x68) >> 0x18 & 0x7f) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_5dc = *(byte *)(local_50 + 0x6b) & 0x7f;
        local_5e0 = *(uint *)(local_50 + 0x68) & 0xffffff;
        Potassco::toString<unsigned_int,unsigned_int>
                  ((uint *)in_stack_fffffffffffff488,
                   (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_5d8);
      std::__cxx11::string::~string(local_5d8);
      break;
    case 0x26:
      Potassco::toString<Clasp::SolverStrategies::SignHeu>
                ((SignHeu *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_600);
      std::__cxx11::string::~string(local_600);
      break;
    case 0x27:
      Potassco::toString<float>
                ((float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,(string *)&stack0xfffffffffffff9d8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff9d8);
      break;
    case 0x28:
      if ((*(uint *)(local_50 + 0x60) & 0xffff) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_64c = (uint)*(ushort *)(local_50 + 0x60);
        local_650 = (uint)*(ushort *)(local_50 + 0x62);
        Potassco::toString<unsigned_int,unsigned_int>
                  ((uint *)in_stack_fffffffffffff488,
                   (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_648);
      std::__cxx11::string::~string(local_648);
      break;
    case 0x29:
      Potassco::toString<Clasp::RestartSchedule>
                ((RestartSchedule *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_670);
      std::__cxx11::string::~string(local_670);
      break;
    case 0x2a:
      local_694 = (uint)((ulong)*(undefined8 *)(local_50 + 0x18) >> 0x3c) & 3;
      Potassco::toString<Clasp::RestartParams::SeqUpdate>
                ((SeqUpdate *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_690);
      std::__cxx11::string::~string(local_690);
      break;
    case 0x2b:
      local_6bc = (uint)((ulong)*(undefined8 *)(local_50 + 0x18) >> 0x3e) & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_6b8);
      std::__cxx11::string::~string(local_6b8);
      break;
    case 0x2c:
      if ((*(ulong *)(local_50 + 0x18) & 0xffff) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_6e4 = (uint)*(ushort *)(local_50 + 0x18);
        local_6e8 = (uint)*(ushort *)(local_50 + 0x1a);
        Potassco::toString<unsigned_int,unsigned_int>
                  ((uint *)in_stack_fffffffffffff488,
                   (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_6e0);
      std::__cxx11::string::~string(local_6e0);
      break;
    case 0x2d:
      Potassco::StringRef::StringRef(&local_6f0,local_20);
      if (local_6f0.out != (string *)0x0) {
        if ((*(ulong *)(local_50 + 0x10) & 0x7fffff) == 0) {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
        else {
          local_6f4 = *(uint *)(local_50 + 0x10) & 0x7fffff;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          local_6f8 = RestartParams::Block::scale((Block *)(local_50 + 0x10));
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          local_6fc = *(uint *)(local_50 + 0x14) & 0x1fffffff;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          local_700 = (uint)((ulong)*(undefined8 *)(local_50 + 0x10) >> 0x3d);
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (Type *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
      }
      break;
    case 0x2e:
      if ((*(ulong *)(local_50 + 0x18) >> 0x20 & 0x3fff) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_724 = *(uint *)(local_50 + 0x1c) & 0x3fff;
        local_728 = (uint)((ulong)*(undefined8 *)(local_50 + 0x18) >> 0x2e) & 0x3fff;
        Potassco::toString<unsigned_int,unsigned_int>
                  ((uint *)in_stack_fffffffffffff488,
                   (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_720);
      std::__cxx11::string::~string(local_720);
      break;
    case 0x2f:
      if ((*(uint *)(local_50 + 0x40) >> 0xb & 0x7f) == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_74c = *(uint *)(local_50 + 0x40) >> 0x1b & 3;
        local_750 = *(uint *)(local_50 + 0x40) >> 0xb & 0x7f;
        local_754 = *(uint *)(local_50 + 0x40) >> 0x19 & 3;
        Potassco::
        toString<Clasp::ReduceStrategy::Algorithm,unsigned_int,Clasp::ReduceStrategy::Score>
                  ((Algorithm *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                   (Score *)in_stack_fffffffffffff488);
      }
      std::__cxx11::string::operator=((string *)local_20,local_748);
      std::__cxx11::string::~string(local_748);
      break;
    case 0x30:
      Potassco::StringRef::StringRef(&local_760,local_20);
      if (local_760.out != (string *)0x0) {
        if ((*(float *)(local_50 + 0x4c) != 0.0) || (NAN(*(float *)(local_50 + 0x4c)))) {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (float *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          bVar1 = ScheduleStrategy::disabled((ScheduleStrategy *)(local_50 + 0x30));
          if (!bVar1) {
            Potassco::operator<<
                      ((StringRef *)in_stack_fffffffffffff430,
                       (ScheduleStrategy *)
                       CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          }
        }
        else {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
      }
      break;
    case 0x31:
      Potassco::toString<Clasp::ScheduleStrategy>
                ((ScheduleStrategy *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_780);
      std::__cxx11::string::~string(local_780);
      break;
    case 0x32:
      if ((*(float *)(local_50 + 0x44) != 0.0) || (NAN(*(float *)(local_50 + 0x44)))) {
        local_7a8 = 1.0 / (double)*(float *)(local_50 + 0x44);
        local_7ac = *(int *)(local_50 + 0x54) - *(int *)(local_50 + 0x50);
        Potassco::toString<double,unsigned_int,unsigned_int>
                  (in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                   (uint *)in_stack_fffffffffffff488);
      }
      else {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      std::__cxx11::string::operator=((string *)local_20,local_7a0);
      std::__cxx11::string::~string(local_7a0);
      break;
    case 0x33:
      local_7d4 = *(uint *)(local_50 + 0x40) >> 0x1d & 3;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_7d0);
      std::__cxx11::string::~string(local_7d0);
      break;
    case 0x34:
      Potassco::toString<unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffff488,
                 (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      std::__cxx11::string::operator=((string *)local_20,local_7f8);
      std::__cxx11::string::~string(local_7f8);
      break;
    case 0x35:
      local_81c = *(uint *)(local_50 + 0x40) >> 7 & 0xf;
      local_820 = *(uint *)(local_50 + 0x40) >> 0x1f;
      Potassco::toString<unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffff488,
                 (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      std::__cxx11::string::operator=((string *)local_20,local_818);
      std::__cxx11::string::~string(local_818);
      break;
    case 0x36:
      local_844 = *(uint *)(local_50 + 0x40) >> 0x12 & 0x7f;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_840);
      std::__cxx11::string::~string(local_840);
      break;
    case 0x37:
      local_86c = (in_RDI->asp).erMode;
      Potassco::toString<Clasp::Asp::LogicProgram::ExtendedRuleMode>
                ((ExtendedRuleMode *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_868);
      std::__cxx11::string::~string(local_868);
      break;
    case 0x38:
      local_894 = *(uint *)&(in_RDI->asp).field_0x4 & 0x3ffffff;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_890);
      std::__cxx11::string::~string(local_890);
      break;
    case 0x39:
      local_8bc = *(uint *)&(in_RDI->asp).field_0x4 >> 0x1d & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_8b8);
      std::__cxx11::string::~string(local_8b8);
      break;
    case 0x3a:
      local_8e4 = *(uint *)&(in_RDI->asp).field_0x4 >> 0x1b & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_8e0);
      std::__cxx11::string::~string(local_8e0);
      break;
    case 0x3b:
      local_90c = *(uint *)&(in_RDI->asp).field_0x4 >> 0x1a & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_908);
      std::__cxx11::string::~string(local_908);
      break;
    case 0x3c:
      local_934 = *(uint *)&(in_RDI->asp).field_0x4 >> 0x1f;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_930);
      std::__cxx11::string::~string(local_930);
      break;
    case 0x3d:
      local_95c = *(uint *)&(in_RDI->asp).field_0x4 >> 0x1c & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_958);
      std::__cxx11::string::~string(local_958);
      break;
    case 0x3e:
      local_984 = *(uint *)&(in_RDI->asp).field_0x4 >> 0x1e & 1;
      Potassco::toString<unsigned_int>
                ((uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_980);
      std::__cxx11::string::~string(local_980);
      break;
    case 0x3f:
      Range<unsigned_long>::Range(&local_9c0,0,0xffffffff);
      uVar6 = Range<unsigned_long>::clamp
                        (&local_9c0,
                         (in_RDI->solve).super_ParallelSolveOptions.super_BasicSolveOptions.limit.
                         conflicts);
      local_9ac = (undefined4)uVar6;
      Range<unsigned_long>::Range(&local_9d8,0,0xffffffff);
      uVar6 = Range<unsigned_long>::clamp
                        (&local_9d8,
                         (in_RDI->solve).super_ParallelSolveOptions.super_BasicSolveOptions.limit.
                         restarts);
      local_9c4 = (undefined4)uVar6;
      Potassco::toString<unsigned_int,unsigned_int>
                ((uint *)in_stack_fffffffffffff488,
                 (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      std::__cxx11::string::operator=((string *)local_20,local_9a8);
      std::__cxx11::string::~string(local_9a8);
      break;
    case 0x40:
      local_9fc = (in_RDI->solve).super_ParallelSolveOptions.algorithm.mode;
      Potassco::toString<unsigned_int,Clasp::mt::ParallelSolveOptions::Algorithm::SearchMode>
                ((uint *)in_stack_fffffffffffff488,
                 (SearchMode *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      std::__cxx11::string::operator=((string *)local_20,local_9f8);
      std::__cxx11::string::~string(local_9f8);
      break;
    case 0x41:
      if ((in_RDI->solve).super_ParallelSolveOptions.restarts.maxR == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        Potassco::toString<unsigned_int,Clasp::ScheduleStrategy>
                  ((uint *)in_stack_fffffffffffff488,
                   (ScheduleStrategy *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480)
                  );
      }
      std::__cxx11::string::operator=((string *)local_20,local_a20);
      std::__cxx11::string::~string(local_a20);
      break;
    case 0x42:
      Potassco::StringRef::StringRef(&local_a28,local_20);
      if (local_a28.out != (string *)0x0) {
        if ((uint)(in_RDI->solve).super_ParallelSolveOptions.distribute.super_Policy >> 0x1d == 0) {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
        else {
          local_a2c = (uint)(in_RDI->solve).super_ParallelSolveOptions.distribute.super_Policy >>
                      0x1d;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (Types *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          local_a30 = (in_RDI->solve).super_ParallelSolveOptions.distribute.mode;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (Mode *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          local_a34 = (uint)(in_RDI->solve).super_ParallelSolveOptions.distribute.super_Policy >>
                      0x16 & 0x7f;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
          local_a38 = (uint)(in_RDI->solve).super_ParallelSolveOptions.distribute.super_Policy &
                      0x3fffff;
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (uint *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
      }
      break;
    case 0x43:
      local_a5c = (uint)(in_RDI->solve).super_ParallelSolveOptions.integrate >> 0x1c & 3;
      local_a60 = (uint)(in_RDI->solve).super_ParallelSolveOptions.integrate & 0xfffffff;
      local_a64 = (uint)(in_RDI->solve).super_ParallelSolveOptions.integrate >> 0x1e;
      Potassco::
      toString<Clasp::mt::ParallelSolveOptions::Integration::Filter,unsigned_int,Clasp::mt::ParallelSolveOptions::Integration::Topology>
                ((Filter *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                 (Topology *)in_stack_fffffffffffff488);
      std::__cxx11::string::operator=((string *)local_20,local_a58);
      std::__cxx11::string::~string(local_a58);
      break;
    case 0x44:
      Potassco::toString<Clasp::EnumOptions::EnumType>
                ((EnumType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_a88);
      std::__cxx11::string::~string(local_a88);
      break;
    case 0x45:
      if ((in_RDI->solve).super_EnumOptions.project == 0) {
        Potassco::toString<Potassco::OffType>
                  ((OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      }
      else {
        local_aac = (in_RDI->solve).super_EnumOptions.project >> 1;
        Potassco::toString<Clasp::ProjectMode_t::Mode,unsigned_int>
                  ((Mode *)in_stack_fffffffffffff488,
                   (uint *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
      }
      std::__cxx11::string::operator=((string *)local_20,local_aa8);
      std::__cxx11::string::~string(local_aa8);
      break;
    case 0x46:
      Potassco::toString<long>
                ((long *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
      std::__cxx11::string::operator=((string *)local_20,local_ad0);
      std::__cxx11::string::~string(local_ad0);
      break;
    case 0x47:
      Potassco::StringRef::StringRef(&local_ad8,local_20);
      if (local_ad8.out != (string *)0x0) {
        Potassco::operator<<
                  ((StringRef *)in_stack_fffffffffffff430,
                   (Mode *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        bVar1 = bk_lib::pod_vector<long,_std::allocator<long>_>::empty
                          (&(in_RDI->solve).super_EnumOptions.optBound);
        if (!bVar1) {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (pod_vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
      }
      break;
    case 0x48:
      Potassco::StringRef::StringRef(&local_ae0,local_20);
      if (local_ae0.out != (string *)0x0) {
        bVar1 = bk_lib::pod_vector<long,_std::allocator<long>_>::empty
                          (&(in_RDI->solve).super_EnumOptions.optStop);
        if (bVar1) {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (OffType *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
        else {
          Potassco::operator<<
                    ((StringRef *)in_stack_fffffffffffff430,
                     (pod_vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428));
        }
      }
      break;
    default:
      Potassco::fail(-1,"int Clasp::Cli::ClaspCliConfig::getValue(KeyType, std::string &) const",
                     0x3b2,"false","invalid option",0);
    }
  }
  if (0 < local_3c) {
    local_3c = std::__cxx11::string::length();
  }
  return local_3c;
}

Assistant:

int ClaspCliConfig::getValue(KeyType key, std::string& out) const {
	try {
		const UserConfig* base = active(this, decodeMode(key));
		int16 o = decodeKey(key);
		int   r = isLeafId(o) && base ? 1 : -1;
		if (r > 0 && isOption(o)) {
			POTASSCO_ASSERT(base == this || isTesterOption(o));
			uint32 sId = decodeSolver(key);
			const SolverParams* solver = &base->solver(sId);
			const SolveParams*  search = &base->search(sId);
			// helper macros used in get
			using Potassco::toString; using Potassco::off; using Potassco::Set;
			#define GET_FUN(x)     Potassco::StringRef x(out); if (!x.out);else
			#define GET(...)       out = toString( __VA_ARGS__ )
			#define GET_IF(c, ...) out = ITE((c), toString(__VA_ARGS__), toString(off))
			switch(static_cast<OptionKey>(o)) {
				default: POTASSCO_ASSERT(false, "invalid option");
				#define OPTION(k, e, a, h, _, GET) case opt_##k: { GET ; } break;
				#define CLASP_ALL_GROUPS
				#include <clasp/cli/clasp_cli_options.inl>
			}
			#undef GET_FUN
			#undef GET
			#undef GET_IF
		}
		else if (r > 0 && o == meta_config) {
			if (base->cliConfig < config_max_value) { xconvert(out, static_cast<ConfigKey>(base->cliConfig)); }
			else                                    { out.append(config_[base == testerConfig()]); }
		}
		return r > 0 ? static_cast<int>(out.length()) : r;
	}
	catch (...) { return -2; }
}